

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall cmMakefileTargetGenerator::WriteCommonCodeRules(cmMakefileTargetGenerator *this)

{
  cmMakefile *this_00;
  pointer pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  _Alloc_hider name;
  bool bVar3;
  bool bVar4;
  Encoding EVar5;
  ostream *poVar6;
  char *pcVar7;
  string *psVar8;
  cmGeneratedFileStream *pcVar9;
  char *path;
  char *path_00;
  long lVar10;
  char *path_01;
  char *pcVar11;
  string dependFileNameFull;
  cmGeneratedFileStream depFileStream;
  allocator local_2d9;
  string local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [584];
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,"CMAKE_MAKE_INCLUDE_FROM_ROOT","");
  bVar3 = cmMakefile::IsOn(this_00,(string *)local_278);
  pcVar11 = "";
  if (bVar3) {
    pcVar11 = "$(CMAKE_BINARY_DIR)/";
  }
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  pcVar1 = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,pcVar1,pcVar1 + (this->TargetBuildDirectoryFull)._M_string_length)
  ;
  std::__cxx11::string::append((char *)&local_298);
  pcVar9 = this->BuildFileStream;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar9,"# Include any dependencies generated for this target.\n",0x36);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar9,(this->GlobalGenerator->IncludeDirective)._M_dataplus._M_p,
                      (this->GlobalGenerator->IncludeDirective)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  lVar10 = 0x14;
  if (!bVar3) {
    lVar10 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar11,lVar10);
  pcVar2 = this->LocalGenerator;
  pcVar7 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar2);
  std::__cxx11::string::string((string *)&local_2b8,pcVar7,&local_2d9);
  cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath(&local_2d8,pcVar2,&local_2b8,&local_298)
  ;
  cmSystemTools::ConvertToOutputPath_abi_cxx11_
            ((string *)local_278,(cmSystemTools *)local_2d8._M_dataplus._M_p,path);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_278._0_8_,local_278._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (this->NoRuleMessages == false) {
    pcVar9 = this->BuildFileStream;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar9,"# Include the progress variables for this target.\n",0x32);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)pcVar9,(this->GlobalGenerator->IncludeDirective)._M_dataplus._M_p
                        ,(this->GlobalGenerator->IncludeDirective)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar11,lVar10);
    pcVar2 = this->LocalGenerator;
    pcVar7 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar2);
    std::__cxx11::string::string((string *)&local_2b8,pcVar7,&local_2d9);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_2d8,pcVar2,&local_2b8,&this->ProgressFileNameFull);
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              ((string *)local_278,(cmSystemTools *)local_2d8._M_dataplus._M_p,path_00);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_278._0_8_,local_278._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = cmsys::SystemTools::FileExists(local_298._M_dataplus._M_p);
  name._M_p = local_298._M_dataplus._M_p;
  if (!bVar4) {
    EVar5 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,name._M_p,false,EVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"# Empty dependencies file for ",0x1e);
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"# This may be replaced when dependencies are built.",0x33);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  }
  psVar8 = &this->FlagFileNameFull;
  std::__cxx11::string::_M_assign((string *)psVar8);
  std::__cxx11::string::append((char *)psVar8);
  pcVar9 = (cmGeneratedFileStream *)operator_new(0x248);
  pcVar7 = (this->FlagFileNameFull)._M_dataplus._M_p;
  EVar5 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream(pcVar9,pcVar7,false,EVar5);
  this->FlagFileStream = pcVar9;
  cmGeneratedFileStream::SetCopyIfDifferent(pcVar9,true);
  if (this->FlagFileStream != (cmGeneratedFileStream *)0x0) {
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              (this->LocalGenerator,(ostream *)this->FlagFileStream);
    pcVar9 = this->BuildFileStream;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar9,"# Include the compile flags for this target\'s objects.\n",0x37);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)pcVar9,(this->GlobalGenerator->IncludeDirective)._M_dataplus._M_p
                        ,(this->GlobalGenerator->IncludeDirective)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    lVar10 = 0x14;
    if (!bVar3) {
      lVar10 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar11,lVar10);
    pcVar2 = this->LocalGenerator;
    pcVar11 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar2);
    std::__cxx11::string::string((string *)&local_2b8,pcVar11,&local_2d9);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath(&local_2d8,pcVar2,&local_2b8,psVar8);
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              ((string *)local_278,(cmSystemTools *)local_2d8._M_dataplus._M_p,path_01);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_278._0_8_,local_278._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteCommonCodeRules()
{
  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")
                        ? "$(CMAKE_BINARY_DIR)/"
                        : "");

  // Include the dependencies for the target.
  std::string dependFileNameFull = this->TargetBuildDirectoryFull;
  dependFileNameFull += "/depend.make";
  *this->BuildFileStream
    << "# Include any dependencies generated for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator
           ->MaybeConvertToRelativePath(
             this->LocalGenerator->GetBinaryDirectory(), dependFileNameFull)
           .c_str())
    << "\n\n";

  if (!this->NoRuleMessages) {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator
             ->MaybeConvertToRelativePath(
               this->LocalGenerator->GetBinaryDirectory(),
               this->ProgressFileNameFull)
             .c_str())
      << "\n\n";
  }

  // make sure the depend file exists
  if (!cmSystemTools::FileExists(dependFileNameFull.c_str())) {
    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(
      dependFileNameFull.c_str(), false,
      this->GlobalGenerator->GetMakefileEncoding());
    depFileStream << "# Empty dependencies file for "
                  << this->GeneratorTarget->GetName() << ".\n"
                  << "# This may be replaced when dependencies are built."
                  << std::endl;
  }

  // Open the flags file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->FlagFileNameFull = this->TargetBuildDirectoryFull;
  this->FlagFileNameFull += "/flags.make";
  this->FlagFileStream =
    new cmGeneratedFileStream(this->FlagFileNameFull.c_str(), false,
                              this->GlobalGenerator->GetMakefileEncoding());
  this->FlagFileStream->SetCopyIfDifferent(true);
  if (!this->FlagFileStream) {
    return;
  }
  this->LocalGenerator->WriteDisclaimer(*this->FlagFileStream);

  // Include the flags for the target.
  *this->BuildFileStream
    << "# Include the compile flags for this target's objects.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator
           ->MaybeConvertToRelativePath(
             this->LocalGenerator->GetBinaryDirectory(),
             this->FlagFileNameFull)
           .c_str())
    << "\n\n";
}